

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_16_bit_from_file(FILE *f)

{
  long __off;
  long pos;
  stbi__context s;
  int r;
  FILE *f_local;
  
  __off = ftell((FILE *)f);
  stbi__start_file((stbi__context *)&pos,f);
  s.img_buffer_original_end._4_4_ = stbi__is_16_main((stbi__context *)&pos);
  fseek((FILE *)f,__off,0);
  return s.img_buffer_original_end._4_4_;
}

Assistant:

STBIDEF int stbi_is_16_bit_from_file(FILE *f)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__is_16_main(&s);
   fseek(f,pos,SEEK_SET);
   return r;
}